

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# override.cc
# Opt level: O2

void __thiscall Override::printRaw(Override *this,ostream *s,Architecture *glb)

{
  _Rb_tree_header *p_Var1;
  pointer piVar2;
  AddrSpace *pAVar3;
  FuncProto *this_00;
  ostream *poVar4;
  _Rb_tree_node_base *p_Var5;
  _Base_ptr p_Var6;
  int4 i;
  ulong uVar7;
  allocator local_59;
  Architecture *local_58;
  string local_50;
  
  p_Var1 = &(this->forcegoto)._M_t._M_impl.super__Rb_tree_header;
  local_58 = glb;
  for (p_Var5 = (this->forcegoto)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != p_Var1;
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    poVar4 = std::operator<<(s,"force goto at ");
    poVar4 = operator<<(poVar4,(Address *)(p_Var5 + 1));
    poVar4 = std::operator<<(poVar4," jumping to ");
    poVar4 = operator<<(poVar4,(Address *)&p_Var5[1]._M_left);
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  for (uVar7 = 0;
      piVar2 = (this->deadcodedelay).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar7 < (ulong)((long)(this->deadcodedelay).super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)piVar2 >> 2);
      uVar7 = uVar7 + 1) {
    if (-1 < piVar2[uVar7]) {
      pAVar3 = (local_58->super_AddrSpaceManager).baselist.
               super__Vector_base<AddrSpace_*,_std::allocator<AddrSpace_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar7];
      poVar4 = std::operator<<(s,"dead code delay on ");
      poVar4 = std::operator<<(poVar4,(string *)&pAVar3->name);
      poVar4 = std::operator<<(poVar4," set to ");
      *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
           *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 2;
      poVar4 = (ostream *)
               std::ostream::operator<<
                         (poVar4,(this->deadcodedelay).super__Vector_base<int,_std::allocator<int>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar7]);
      std::endl<char,std::char_traits<char>>(poVar4);
    }
  }
  for (p_Var6 = (this->forcegoto)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != p_Var1; p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
    poVar4 = std::operator<<(s,"override indirect at ");
    poVar4 = operator<<(poVar4,(Address *)(p_Var6 + 1));
    poVar4 = std::operator<<(poVar4," to call directly to ");
    poVar4 = operator<<(poVar4,(Address *)&p_Var6[1]._M_left);
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  for (p_Var6 = (this->protoover)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != &(this->protoover)._M_t._M_impl.super__Rb_tree_header;
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
    poVar4 = std::operator<<(s,"override prototype at ");
    poVar4 = operator<<(poVar4,(Address *)(p_Var6 + 1));
    std::operator<<(poVar4," to ");
    this_00 = (FuncProto *)p_Var6[1]._M_left;
    std::__cxx11::string::string((string *)&local_50,"func",&local_59);
    FuncProto::printRaw(this_00,&local_50,s);
    std::__cxx11::string::~string((string *)&local_50);
    std::endl<char,std::char_traits<char>>(s);
  }
  return;
}

Assistant:

void Override::printRaw(ostream &s,Architecture *glb) const

{
  map<Address,Address>::const_iterator iter;

  for(iter=forcegoto.begin();iter!=forcegoto.end();++iter)
    s << "force goto at " << (*iter).first << " jumping to " << (*iter).second << endl;

  for(int4 i=0;i<deadcodedelay.size();++i) {
    if (deadcodedelay[i] < 0) continue;
    AddrSpace *spc = glb->getSpace(i);
    s << "dead code delay on " << spc->getName() << " set to " << dec << deadcodedelay[i] << endl;
  }

  for(iter=forcegoto.begin();iter!=forcegoto.end();++iter)
    s << "override indirect at " << (*iter).first << " to call directly to " << (*iter).second << endl;

  map<Address,FuncProto *>::const_iterator fiter;

  for(fiter=protoover.begin();fiter!=protoover.end();++fiter) {
    s << "override prototype at " << (*fiter).first << " to ";
    (*fiter).second->printRaw("func",s);
    s << endl;
  }
}